

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

Image * rw::ps2::rasterToImage(Raster *raster)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  Image *this;
  uint8 *puVar4;
  int iVar5;
  long lVar6;
  int32 x;
  int iVar7;
  uint uVar8;
  uint8 *out;
  uint8 *puVar9;
  int minh;
  int minw;
  
  uVar1 = raster->format;
  uVar8 = uVar1 & 0xf00;
  iVar5 = 0;
  if ((uVar1 >> 0xe & 1) == 0) {
    iVar7 = 0x18;
    if (uVar8 != 0x600) {
      iVar7 = (uint)(uVar8 == 0x500) * 0x10 + 0x10;
    }
    bVar2 = true;
    if ((uVar1 >> 0xd & 1) == 0) goto LAB_00125ca8;
    iVar7 = 8;
    iVar5 = 0x100;
  }
  else {
    iVar7 = 4;
    iVar5 = 0x10;
  }
  bVar2 = false;
LAB_00125ca8:
  lVar3 = (long)nativeRasterOffset;
  this = Image::create(raster->width,raster->height,iVar7);
  Image::allocate(this);
  if (!bVar2) {
    puVar9 = this->palette;
    puVar4 = Raster::lockPalette(raster,2);
    if (uVar8 == 0x500) {
      memcpy(puVar9,puVar4,(ulong)(uint)(iVar5 * 4));
      for (lVar6 = 0; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
        puVar9[lVar6 * 4 + 3] = (uint8)((uint)puVar9[lVar6 * 4 + 3] * 0xff >> 7);
      }
    }
    else {
      memcpy(puVar9,puVar4,(ulong)(uint)(iVar5 * 2));
    }
    Raster::unlockPalette(raster);
  }
  transferMinSize((iVar7 == 4) + 0x13,(int)*(char *)((long)&raster->pixels + lVar3 + 4),&minw,&minh)
  ;
  if (minw < raster->width) {
    minw = raster->width;
  }
  puVar9 = this->pixels;
  puVar4 = Raster::lock(raster,0,2);
  if (iVar7 == 4) {
    expandPal4(puVar9,this->stride,puVar4,minw / 2,raster->width,raster->height);
  }
  else if (iVar7 == 8) {
    copyPal8(puVar9,this->stride,puVar4,minw,raster->width,raster->height);
  }
  else {
    for (iVar5 = 0; iVar5 < this->height; iVar5 = iVar5 + 1) {
      out = puVar9;
      for (iVar7 = 0; iVar7 < this->width; iVar7 = iVar7 + 1) {
        switch((raster->format & 0xf00U) - 0x100 >> 8) {
        case 0:
          conv_ABGR1555_from_ARGB1555(out,puVar4);
          break;
        default:
          goto switchD_00125e4c_caseD_1;
        case 4:
          *out = *puVar4;
          out[1] = puVar4[1];
          out[2] = puVar4[2];
          out[3] = (uint8)((uint)puVar4[3] * 0xff >> 7);
          goto LAB_00125ea9;
        case 5:
          *out = *puVar4;
          out[1] = puVar4[1];
          out[2] = puVar4[2];
LAB_00125ea9:
          puVar4 = puVar4 + 4;
          goto switchD_00125e4c_caseD_1;
        case 9:
          conv_ABGR1555_from_ARGB1555(out,puVar4);
          out[1] = out[1] | 0x80;
        }
        puVar4 = puVar4 + 2;
switchD_00125e4c_caseD_1:
        out = out + this->bpp;
      }
      puVar9 = puVar9 + this->stride;
    }
  }
  Raster::unlock(raster,0);
  return this;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	Image *image;
	int depth;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 rasterFormat = raster->format & 0xF00;
	switch(rasterFormat){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported ps2 raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = raster->lockPalette(Raster::LOCKREAD);
		if(rasterFormat == Raster::C8888){
			memcpy(out, in, pallength*4);
			for(int32 i = 0; i < pallength; i++){
				out[3] = out[3]*255/128;
				out += 4;
			}
		}else
			memcpy(out, in, pallength*2);
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(raster->width, minw);
	uint8 *dst = image->pixels;
	in = raster->lock(0, Raster::LOCKREAD);
	if(depth == 4){
		expandPal4(dst, image->stride, in, tw/2, raster->width, raster->height);
	}else if(depth == 8){
		copyPal8(dst, image->stride, in, tw, raster->width, raster->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			out = dst;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*255/128;
					in += 4;
					break;
				case Raster::C888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					in += 4;
					break;
				case Raster::C1555:
					conv_ARGB1555_from_ABGR1555(out, in);
					in += 2;
					break;
				case Raster::C555:
					conv_ARGB1555_from_ABGR1555(out, in);
					out[1] |= 0x80;
					in += 2;
					break;
				default:
					assert(0 && "unknown ps2 raster format");
					break;
				}
				out += image->bpp;
			}
			dst += image->stride;
		}
	}
	raster->unlock(0);

	return image;
}